

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>
::fastAccessDx(FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>
               *this,int i)

{
  Fad<double> *pFVar1;
  Fad<double> *pFVar2;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *pFVar3;
  FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *pFVar4;
  value_type vVar5;
  
  vVar5 = FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>
          ::fastAccessDx(&this->left_->fadexpr_,i);
  pFVar1 = (this->right_->fadexpr_).left_;
  pFVar2 = (this->right_->fadexpr_).right_;
  pFVar3 = (this->left_->fadexpr_).left_;
  pFVar4 = (this->left_->fadexpr_).right_;
  return vVar5 * (pFVar1->val_ - pFVar2->val_) +
         (((pFVar4->fadexpr_).left_)->val_ - ((pFVar4->fadexpr_).right_)->val_) *
         ((pFVar3->fadexpr_).left_)->val_ * ((pFVar3->fadexpr_).right_)->val_ *
         ((pFVar1->dx_).ptr_to_data[i] - (pFVar2->dx_).ptr_to_data[i]);
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) * right_.val() + right_.fastAccessDx(i) * left_.val();}